

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O2

uint spvtools::utils::SignExtendValue<unsigned_int>(uint value,uint32_t number_of_bits)

{
  bool bVar1;
  uint uVar2;
  
  if (number_of_bits == 0x20) {
    return value;
  }
  bVar1 = IsBitAtPositionSet<unsigned_int>(value,(ulong)(number_of_bits - 1));
  if (bVar1) {
    uVar2 = SetHighBits<unsigned_int>(value,(ulong)(0x20 - number_of_bits));
    return uVar2;
  }
  uVar2 = ClearHighBits<unsigned_int>(value,(ulong)(0x20 - number_of_bits));
  return uVar2;
}

Assistant:

T SignExtendValue(T value, uint32_t number_of_bits) {
  const uint32_t bit_width = sizeof(value) * 8;
  if (number_of_bits == bit_width) return value;

  bool is_negative = utils::IsBitAtPositionSet(value, number_of_bits - 1);
  if (is_negative) {
    value = utils::SetHighBits(value, bit_width - number_of_bits);
  } else {
    value = utils::ClearHighBits(value, bit_width - number_of_bits);
  }
  return value;
}